

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListViewPrivate::selectAll(QListViewPrivate *this,SelectionFlags command)

{
  QPersistentModelIndex *this_00;
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  QObject *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar7;
  int iVar8;
  long in_FS_OFFSET;
  Bucket BVar9;
  QPersistentModelIndexData *local_b8;
  QPersistentModelIndexData *pQStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_a8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QPersistentModelIndexData *local_58;
  QPersistentModelIndexData *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->super_QAbstractItemViewPrivate).selectionModel.wp.value != (QObject *)0x0)) {
    local_98.d = (Data *)0x0;
    local_98.ptr = (QItemSelectionRange *)0x0;
    local_98.size = 0;
    local_b8 = (QPersistentModelIndexData *)0xffffffffffffffff;
    pQStack_b0 = (QPersistentModelIndexData *)0x0;
    tStack_a8.ptr = (QAbstractItemModel *)0x0;
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    this_00 = &(this->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    iVar5 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,(QModelIndex *)&local_58);
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    iVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_58);
    if (0 < iVar6) {
      iVar4 = 0;
      do {
        iVar8 = iVar4;
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        pQVar2 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_78,pQVar2,iVar8,0,(QModelIndex *)&local_58);
        local_48.ptr = local_78.m.ptr;
        local_58 = (QPersistentModelIndexData *)local_78._0_8_;
        pQStack_50 = (QPersistentModelIndexData *)local_78.i;
        this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
        if (this_01 ==
            (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             *)0x0) {
LAB_005692b6:
          if ((((int)local_b8 < 0) || ((long)local_b8 < 0)) ||
             (tStack_a8.ptr == (QAbstractItemModel *)0x0)) {
            pQVar2 = (this->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
            (**(code **)(*(long *)pQVar2 + 0x60))((QModelIndex *)&local_58,pQVar2,iVar8,0,&local_78)
            ;
            tStack_a8.ptr = local_48.ptr;
            local_b8 = local_58;
            pQStack_b0 = pQStack_50;
          }
        }
        else {
          BVar9 = QHashPrivate::
                  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  ::findBucket<QtPrivate::QModelIndexWrapper>
                            (this_01,(QModelIndexWrapper *)&local_58);
          if ((BVar9.span[BVar9.index] == (Span)0xff) || (*(long *)(BVar9.span + 0x80) == 0))
          goto LAB_005692b6;
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,&local_78)
          ;
          this_02 = (this->hiddenRows).q_hash.d;
          if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
            goto LAB_005692b6;
          }
          pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                   findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_58);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
          if (pNVar7 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_005692b6;
          if (((-1 < (int)local_b8) && (-1 < (long)local_b8)) &&
             (tStack_a8.ptr != (QAbstractItemModel *)0x0)) {
            local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_58 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_50 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar2 = (this->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
            (**(code **)(*(long *)pQVar2 + 0x60))
                      ((QModelIndex *)&local_58,pQVar2,iVar8 + -1,iVar5 + -1,&local_78);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_b8);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_78.i,(QModelIndex *)&local_58);
            QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                      ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                       (QItemSelectionRange *)&local_78);
            QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78.i);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
            pQStack_b0 = (QPersistentModelIndexData *)0x0;
            tStack_a8.ptr = (QAbstractItemModel *)0x0;
            local_b8 = (QPersistentModelIndexData *)0xffffffffffffffff;
          }
        }
        iVar4 = iVar8 + 1;
      } while (iVar6 != iVar8 + 1);
      if (((-1 < (int)local_b8) && (-1 < (long)local_b8)) &&
         (tStack_a8.ptr != (QAbstractItemModel *)0x0)) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_50 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar2 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
        (**(code **)(*(long *)pQVar2 + 0x60))
                  ((QModelIndex *)&local_58,pQVar2,iVar8,iVar5 + -1,&local_78);
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_b8);
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_78.i,(QModelIndex *)&local_58);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                   (QItemSelectionRange *)&local_78);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
      }
    }
    if (local_98.size != 0) {
      pQVar3 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
      (**(code **)(*(long *)pQVar3 + 0x70))
                (pQVar3,&local_98,
                 command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::selectAll(QItemSelectionModel::SelectionFlags command)
{
    if (!selectionModel)
        return;

    QItemSelection selection;
    QModelIndex topLeft;
    int row = 0;
    const int colCount = model->columnCount(root);
    const int rowCount = model->rowCount(root);
    for ( ; row < rowCount; ++row) {
        if (isHidden(row)) {
            //it might be the end of a selection range
            if (topLeft.isValid()) {
                QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
                selection.append(QItemSelectionRange(topLeft, bottomRight));
                topLeft = QModelIndex();
            }
            continue;
        }

        if (!topLeft.isValid()) //start of a new selection range
            topLeft = model->index(row, 0, root);
    }

    if (topLeft.isValid()) {
        //last selected range
        QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
        selection.append(QItemSelectionRange(topLeft, bottomRight));
    }

    if (!selection.isEmpty())
        selectionModel->select(selection, command);
}